

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_connect(Curl_easy *data,_Bool *done)

{
  connectdata *conn_00;
  pingpong *pp;
  imap_conn *imapc;
  connectdata *conn;
  CURLcode result;
  _Bool *done_local;
  Curl_easy *data_local;
  
  conn_00 = data->conn;
  *done = false;
  Curl_conncontrol(conn_00,0);
  (conn_00->proto).smbc.send_buf = (char *)0x1d4c0;
  (conn_00->proto).ftpc.pp.statemachine = imap_statemachine;
  (conn_00->proto).ftpc.pp.endofresp = imap_endofresp;
  (conn_00->proto).imapc.preftype = '\x03';
  Curl_sasl_init(&(conn_00->proto).imapc.sasl,data,&saslimap);
  Curl_dyn_init(&(conn_00->proto).imapc.dyn,0x10000);
  Curl_pp_init(&(conn_00->proto).ftpc.pp);
  data_local._4_4_ = imap_parse_url_options(conn_00);
  if (data_local._4_4_ == CURLE_OK) {
    imap_state(data,IMAP_SERVERGREET);
    strcpy((conn_00->proto).imapc.resptag,"*");
    data_local._4_4_ = imap_multi_statemach(data,done);
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode imap_connect(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct imap_conn *imapc = &conn->proto.imapc;
  struct pingpong *pp = &imapc->pp;

  *done = FALSE; /* default to not done yet */

  /* We always support persistent connections in IMAP */
  connkeep(conn, "IMAP default");

  PINGPONG_SETUP(pp, imap_statemachine, imap_endofresp);

  /* Set the default preferred authentication type and mechanism */
  imapc->preftype = IMAP_TYPE_ANY;
  Curl_sasl_init(&imapc->sasl, data, &saslimap);

  Curl_dyn_init(&imapc->dyn, DYN_IMAP_CMD);
  Curl_pp_init(pp);

  /* Parse the URL options */
  result = imap_parse_url_options(conn);
  if(result)
    return result;

  /* Start off waiting for the server greeting response */
  imap_state(data, IMAP_SERVERGREET);

  /* Start off with an response id of '*' */
  strcpy(imapc->resptag, "*");

  result = imap_multi_statemach(data, done);

  return result;
}